

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ze_nullddi.cpp
# Opt level: O0

ze_result_t
driver::zePhysicalMemCreate
          (ze_context_handle_t hContext,ze_device_handle_t hDevice,ze_physical_mem_desc_t *desc,
          ze_physical_mem_handle_t *phPhysicalMemory)

{
  ze_physical_mem_handle_t p_Var1;
  ze_pfnPhysicalMemCreate_t pfnCreate;
  ze_result_t result;
  ze_physical_mem_handle_t *phPhysicalMemory_local;
  ze_physical_mem_desc_t *desc_local;
  ze_device_handle_t hDevice_local;
  ze_context_handle_t hContext_local;
  
  pfnCreate._4_4_ = ZE_RESULT_SUCCESS;
  if (DAT_0011c710 == (code *)0x0) {
    p_Var1 = (ze_physical_mem_handle_t)context_t::get((context_t *)&context);
    *phPhysicalMemory = p_Var1;
  }
  else {
    pfnCreate._4_4_ = (*DAT_0011c710)(hContext,hDevice,desc,phPhysicalMemory);
  }
  return pfnCreate._4_4_;
}

Assistant:

__zedlllocal ze_result_t ZE_APICALL
    zePhysicalMemCreate(
        ze_context_handle_t hContext,                   ///< [in] handle of the context object
        ze_device_handle_t hDevice,                     ///< [in] handle of the device object, can be `nullptr` if creating
                                                        ///< physical host memory.
        ze_physical_mem_desc_t* desc,                   ///< [in] pointer to physical memory descriptor.
        ze_physical_mem_handle_t* phPhysicalMemory      ///< [out] pointer to handle of physical memory object created
        )
    {
        ze_result_t result = ZE_RESULT_SUCCESS;

        // if the driver has created a custom function, then call it instead of using the generic path
        auto pfnCreate = context.zeDdiTable.PhysicalMem.pfnCreate;
        if( nullptr != pfnCreate )
        {
            result = pfnCreate( hContext, hDevice, desc, phPhysicalMemory );
        }
        else
        {
            // generic implementation
            *phPhysicalMemory = reinterpret_cast<ze_physical_mem_handle_t>( context.get() );

        }

        return result;
    }